

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O0

void parse_gd3(byte_ *in,byte_ *end,track_info_t *out)

{
  byte_ *in_RDX;
  byte_ *in_RSI;
  
  get_gd3_pair(in_RSI,in_RDX,(char *)0x96518c);
  get_gd3_pair(in_RSI,in_RDX,(char *)0x9651ab);
  get_gd3_pair(in_RSI,in_RDX,(char *)0x9651c7);
  get_gd3_pair(in_RSI,in_RDX,(char *)0x9651e6);
  get_gd3_str(in,end,(char *)out);
  get_gd3_pair(in_RSI,in_RDX,(char *)0x965224);
  get_gd3_str(in,end,(char *)out);
  return;
}

Assistant:

static void parse_gd3( byte const* in, byte const* end, track_info_t* out )
{
	in = get_gd3_pair( in, end, out->song );
	in = get_gd3_pair( in, end, out->game );
	in = get_gd3_pair( in, end, out->system );
	in = get_gd3_pair( in, end, out->author );
	in = get_gd3_str ( in, end, out->copyright );
	in = get_gd3_pair( in, end, out->dumper );
	in = get_gd3_str ( in, end, out->comment );
}